

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  utsname uts_name;
  char temp [1024];
  allocator local_5d2;
  allocator local_5d1;
  string local_5d0;
  string local_5b0;
  utsname local_590;
  string local_408 [32];
  
  std::__cxx11::string::string((string *)local_408,"UNIX",(allocator *)&local_5d0);
  std::__cxx11::string::string((string *)&local_590,"1",(allocator *)&local_5b0);
  SetDefinition(this,local_408,(string *)&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::string::string((string *)local_408,"CMAKE_HOST_UNIX",(allocator *)&local_5d0);
  std::__cxx11::string::string((string *)&local_590,"1",(allocator *)&local_5b0);
  SetDefinition(this,local_408,(string *)&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)local_408);
  iVar1 = uname(&local_590);
  if (-1 < iVar1) {
    std::__cxx11::string::string
              ((string *)local_408,"CMAKE_HOST_SYSTEM_NAME",(allocator *)&local_5b0);
    std::__cxx11::string::string((string *)&local_5d0,local_590.sysname,&local_5d2);
    SetDefinition(this,local_408,&local_5d0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)local_408);
  }
  uVar2 = cmVersion::GetMinorVersion();
  sprintf((char *)local_408,"%d",(ulong)uVar2);
  std::__cxx11::string::string((string *)&local_5d0,"CMAKE_MINOR_VERSION",&local_5d2);
  std::__cxx11::string::string((string *)&local_5b0,(char *)local_408,&local_5d1);
  SetDefinition(this,&local_5d0,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  uVar2 = cmVersion::GetMajorVersion();
  sprintf((char *)local_408,"%d",(ulong)uVar2);
  std::__cxx11::string::string((string *)&local_5d0,"CMAKE_MAJOR_VERSION",&local_5d2);
  std::__cxx11::string::string((string *)&local_5b0,(char *)local_408,&local_5d1);
  SetDefinition(this,&local_5d0,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  uVar2 = cmVersion::GetPatchVersion();
  sprintf((char *)local_408,"%d",(ulong)uVar2);
  std::__cxx11::string::string((string *)&local_5d0,"CMAKE_PATCH_VERSION",&local_5d2);
  std::__cxx11::string::string((string *)&local_5b0,(char *)local_408,&local_5d1);
  SetDefinition(this,&local_5d0,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  uVar2 = cmVersion::GetTweakVersion();
  sprintf((char *)local_408,"%d",(ulong)uVar2);
  std::__cxx11::string::string((string *)&local_5d0,"CMAKE_TWEAK_VERSION",&local_5d2);
  std::__cxx11::string::string((string *)&local_5b0,(char *)local_408,&local_5d1);
  SetDefinition(this,&local_5d0,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::string((string *)&local_5d0,"CMAKE_VERSION",&local_5d2);
  pcVar3 = cmVersion::GetCMakeVersion();
  std::__cxx11::string::string((string *)&local_5b0,pcVar3,&local_5d1);
  SetDefinition(this,&local_5d0,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::string((string *)&local_5d0,"CMAKE_FILES_DIRECTORY",&local_5d2);
  std::__cxx11::string::string((string *)&local_5b0,"/CMakeFiles",&local_5d1);
  SetDefinition(this,&local_5d0,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  std::__cxx11::string::string
            ((string *)&local_5d0,"INCLUDE_REGULAR_EXPRESSION",(allocator *)&local_5b0);
  cmPropertyMap::SetProperty(&pBVar5->Properties,&local_5d0,"^.*$");
  std::__cxx11::string::~string((string *)&local_5d0);
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
/* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
  With CMake must separate between target and host platform. In most cases
  the tests for WIN32, UNIX and APPLE will be for the target system, so an
  additional set of variables for the host system is required ->
  CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
  WIN32, UNIX and APPLE are now set in the platform files in
  Modules/Platforms/.
  To keep cmake scripts (-P) and custom language and compiler modules
  working, these variables are still also set here in this place, but they
  will be reset in CMakeSystemSpecificInformation.cmake before the platform
  files are executed. */
#if defined(_WIN32)
  this->SetDefinition("WIN32", "1");
  this->SetDefinition("CMAKE_HOST_WIN32", "1");
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", "Windows");
#else
  this->SetDefinition("UNIX", "1");
  this->SetDefinition("CMAKE_HOST_UNIX", "1");

  struct utsname uts_name;
  if (uname(&uts_name) >= 0) {
    this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", uts_name.sysname);
  }
#endif
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmSystemTools::IsOn(legacy.c_str())) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

  char temp[1024];
  sprintf(temp, "%d", cmVersion::GetMinorVersion());
  this->SetDefinition("CMAKE_MINOR_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetMajorVersion());
  this->SetDefinition("CMAKE_MAJOR_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetPatchVersion());
  this->SetDefinition("CMAKE_PATCH_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetTweakVersion());
  this->SetDefinition("CMAKE_TWEAK_VERSION", temp);
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY",
                      cmake::GetCMakeFilesDirectory());

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}